

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpCommsSS::~TcpCommsSS(TcpCommsSS *this)

{
  ~TcpCommsSS(this);
  operator_delete(this,0x500);
  return;
}

Assistant:

TcpCommsSS::~TcpCommsSS()
{
    disconnect();
}